

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O0

bool __thiscall
Fossilize::StateReplayer::Impl::parse_image_robustness_features
          (Impl *this,Value *state,VkPhysicalDeviceImageRobustnessFeaturesEXT **out_features)

{
  uint uVar1;
  VkPhysicalDeviceImageRobustnessFeatures *pVVar2;
  Type this_00;
  VkPhysicalDeviceImageRobustnessFeatures *features;
  VkPhysicalDeviceImageRobustnessFeaturesEXT **out_features_local;
  Value *state_local;
  Impl *this_local;
  
  pVVar2 = ScratchAllocator::allocate_cleared<VkPhysicalDeviceImageRobustnessFeatures>
                     (&this->allocator);
  *out_features = pVVar2;
  this_00 = rapidjson::
            GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
            ::operator[]<char_const>
                      ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                        *)state,"robustImageAccess");
  uVar1 = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::GetUint(this_00);
  pVVar2->robustImageAccess = uVar1;
  return true;
}

Assistant:

bool StateReplayer::Impl::parse_image_robustness_features(const Value &state,
                                                          VkPhysicalDeviceImageRobustnessFeaturesEXT **out_features)
{
	auto *features = allocator.allocate_cleared<VkPhysicalDeviceImageRobustnessFeaturesEXT>();
	*out_features = features;

	features->robustImageAccess = state["robustImageAccess"].GetUint();
	return true;
}